

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transformer.cpp
# Opt level: O2

idx_t __thiscall duckdb::Transformer::ParamCount(Transformer *this)

{
  Transformer *pTVar1;
  
  pTVar1 = RootTransformer(this);
  return pTVar1->prepared_statement_parameter_index;
}

Assistant:

idx_t Transformer::ParamCount() const {
	auto &root = RootTransformer();
	return root.prepared_statement_parameter_index;
}